

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O2

void __thiscall
t_xsd_generator::generate_element
          (t_xsd_generator *this,ostream *out,string *name,t_type *ttype,t_struct *attrs,
          bool optional,bool nillable,bool list_element)

{
  int *piVar1;
  t_type *ttype_00;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined7 in_register_00000089;
  pointer pptVar6;
  char *pcVar7;
  string subname;
  string soptional;
  string snillable;
  string smaxOccurs;
  string sminOccurs;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar7 = "";
  pcVar3 = "";
  if (list_element) {
    pcVar3 = " minOccurs=\"0\"";
  }
  pcVar5 = " maxOccurs=\"unbounded\"";
  if (!list_element) {
    pcVar5 = "";
  }
  if ((int)CONCAT71(in_register_00000089,optional) != 0) {
    pcVar3 = " minOccurs=\"0\"";
  }
  std::__cxx11::string::string((string *)&local_50,pcVar3,(allocator *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,pcVar5,(allocator *)&local_f0);
  std::operator+(&local_f0,&local_50,&local_b0);
  if (nillable) {
    pcVar7 = " nillable=\"true\"";
  }
  std::__cxx11::string::string(local_d0,pcVar7,(allocator *)&local_110);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 == '\0') {
      if (attrs == (t_struct *)0x0) {
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"<xsd:element name=\"");
        poVar4 = std::operator<<(poVar4,(string *)name);
        poVar4 = std::operator<<(poVar4,"\"");
        poVar4 = std::operator<<(poVar4," type=\"");
        type_name_abi_cxx11_(&local_110,this,ttype);
        poVar4 = std::operator<<(poVar4,(string *)&local_110);
        poVar4 = std::operator<<(poVar4,"\"");
        poVar4 = std::operator<<(poVar4,(string *)&local_f0);
        poVar4 = std::operator<<(poVar4,local_d0);
        poVar4 = std::operator<<(poVar4," />");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_110);
      }
      else {
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"<xsd:element name=\"");
        poVar4 = std::operator<<(poVar4,(string *)name);
        poVar4 = std::operator<<(poVar4,"\"");
        poVar4 = std::operator<<(poVar4,(string *)&local_f0);
        poVar4 = std::operator<<(poVar4,local_d0);
        poVar4 = std::operator<<(poVar4,">");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"<xsd:complexType>");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"<xsd:complexContent>");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"<xsd:extension base=\"");
        type_name_abi_cxx11_(&local_110,this,ttype);
        poVar4 = std::operator<<(poVar4,(string *)&local_110);
        poVar4 = std::operator<<(poVar4,"\">");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_110);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        for (pptVar6 = (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pptVar6 !=
            (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
          poVar4 = t_generator::indent(&this->super_t_generator,out);
          poVar4 = std::operator<<(poVar4,"<xsd:attribute name=\"");
          poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
          poVar4 = std::operator<<(poVar4,"\" type=\"");
          type_name_abi_cxx11_(&local_110,this,(*pptVar6)->type_);
          poVar4 = std::operator<<(poVar4,(string *)&local_110);
          poVar4 = std::operator<<(poVar4,"\" />");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_110);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"</xsd:extension>");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"</xsd:complexContent>");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"</xsd:complexType>");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"</xsd:element>");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      goto LAB_002c18b3;
    }
  }
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"<xsd:element name=\"");
  poVar4 = std::operator<<(poVar4,(string *)name);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4,local_d0);
  poVar4 = std::operator<<(poVar4,">");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  if (attrs == (t_struct *)0x0) {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
    if ((char)iVar2 == '\0') goto LAB_002c11fc;
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    pcVar3 = "<xsd:complexType />";
  }
  else {
LAB_002c11fc:
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    poVar4 = std::operator<<(poVar4,"<xsd:complexType>");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"<xsd:sequence minOccurs=\"0\" maxOccurs=\"unbounded\">");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      ttype_00 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
      iVar2 = (*(ttype_00->super_t_doc)._vptr_t_doc[5])(ttype_00);
      if ((char)iVar2 == '\0') {
        iVar2 = (*(ttype_00->super_t_doc)._vptr_t_doc[0xd])(ttype_00);
        if ((char)iVar2 != '\0') goto LAB_002c12a7;
        type_name_abi_cxx11_(&local_70,this,ttype_00);
      }
      else {
LAB_002c12a7:
        std::operator+(&local_70,name,"_elt");
      }
      std::__cxx11::string::operator=((string *)&local_110,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      poVar4 = std::operator<<((ostream *)&this->f_php_,"$GLOBALS[\'");
      poVar4 = std::operator<<(poVar4,(string *)&((this->super_t_generator).program_)->name_);
      poVar4 = std::operator<<(poVar4,"_xsd_elt_");
      poVar4 = std::operator<<(poVar4,(string *)name);
      poVar4 = std::operator<<(poVar4,"\'] = \'");
      poVar4 = std::operator<<(poVar4,(string *)&local_110);
      poVar4 = std::operator<<(poVar4,"\';");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_90,(string *)&local_110);
      generate_element(this,out,&local_90,ttype_00,(t_struct *)0x0,false,false,true);
      std::__cxx11::string::~string((string *)&local_90);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"</xsd:sequence>");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      poVar4 = std::operator<<(poVar4,"<xsd:attribute name=\"list\" type=\"xsd:boolean\" />");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_110);
    }
    if (attrs != (t_struct *)0x0) {
      for (pptVar6 = (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar6 !=
          (attrs->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::operator<<(poVar4,"<xsd:attribute name=\"");
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
        poVar4 = std::operator<<(poVar4,"\" type=\"");
        type_name_abi_cxx11_(&local_110,this,(*pptVar6)->type_);
        poVar4 = std::operator<<(poVar4,(string *)&local_110);
        poVar4 = std::operator<<(poVar4,"\" />");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_110);
      }
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    pcVar3 = "</xsd:complexType>";
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"</xsd:element>");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
LAB_002c18b3:
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_xsd_generator::generate_element(ostream& out,
                                       string name,
                                       t_type* ttype,
                                       t_struct* attrs,
                                       bool optional,
                                       bool nillable,
                                       bool list_element) {
  string sminOccurs = (optional || list_element) ? " minOccurs=\"0\"" : "";
  string smaxOccurs = list_element ? " maxOccurs=\"unbounded\"" : "";
  string soptional = sminOccurs + smaxOccurs;
  string snillable = nillable ? " nillable=\"true\"" : "";

  if (ttype->is_void() || ttype->is_list()) {
    indent(out) << "<xsd:element name=\"" << name << "\"" << soptional << snillable << ">" << endl;
    indent_up();
    if (attrs == nullptr && ttype->is_void()) {
      indent(out) << "<xsd:complexType />" << endl;
    } else {
      indent(out) << "<xsd:complexType>" << endl;
      indent_up();
      if (ttype->is_list()) {
        indent(out) << "<xsd:sequence minOccurs=\"0\" maxOccurs=\"unbounded\">" << endl;
        indent_up();
        string subname;
        t_type* subtype = ((t_list*)ttype)->get_elem_type();
        if (subtype->is_base_type() || subtype->is_container()) {
          subname = name + "_elt";
        } else {
          subname = type_name(subtype);
        }
        f_php_ << "$GLOBALS['" << program_->get_name() << "_xsd_elt_" << name << "'] = '" << subname
               << "';" << endl;
        generate_element(out, subname, subtype, nullptr, false, false, true);
        indent_down();
        indent(out) << "</xsd:sequence>" << endl;
        indent(out) << "<xsd:attribute name=\"list\" type=\"xsd:boolean\" />" << endl;
      }
      if (attrs != nullptr) {
        const vector<t_field*>& members = attrs->get_members();
        vector<t_field*>::const_iterator a_iter;
        for (a_iter = members.begin(); a_iter != members.end(); ++a_iter) {
          indent(out) << "<xsd:attribute name=\"" << (*a_iter)->get_name() << "\" type=\""
                      << type_name((*a_iter)->get_type()) << "\" />" << endl;
        }
      }
      indent_down();
      indent(out) << "</xsd:complexType>" << endl;
    }
    indent_down();
    indent(out) << "</xsd:element>" << endl;
  } else {
    if (attrs == nullptr) {
      indent(out) << "<xsd:element name=\"" << name << "\""
                  << " type=\"" << type_name(ttype) << "\"" << soptional << snillable << " />"
                  << endl;
    } else {
      // Wow, all this work for a SIMPLE TYPE with attributes?!?!?!
      indent(out) << "<xsd:element name=\"" << name << "\"" << soptional << snillable << ">"
                  << endl;
      indent_up();
      indent(out) << "<xsd:complexType>" << endl;
      indent_up();
      indent(out) << "<xsd:complexContent>" << endl;
      indent_up();
      indent(out) << "<xsd:extension base=\"" << type_name(ttype) << "\">" << endl;
      indent_up();
      const vector<t_field*>& members = attrs->get_members();
      vector<t_field*>::const_iterator a_iter;
      for (a_iter = members.begin(); a_iter != members.end(); ++a_iter) {
        indent(out) << "<xsd:attribute name=\"" << (*a_iter)->get_name() << "\" type=\""
                    << type_name((*a_iter)->get_type()) << "\" />" << endl;
      }
      indent_down();
      indent(out) << "</xsd:extension>" << endl;
      indent_down();
      indent(out) << "</xsd:complexContent>" << endl;
      indent_down();
      indent(out) << "</xsd:complexType>" << endl;
      indent_down();
      indent(out) << "</xsd:element>" << endl;
    }
  }
}